

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Ant * __thiscall
Ant::step(Ant *this,vector<Wall,_std::allocator<Wall>_> *walls,
         vector<Pheromone,_std::allocator<Pheromone>_> *pheromones,
         vector<Gate,_std::allocator<Gate>_> *gates)

{
  int iVar1;
  double dVar2;
  pair<int,_int> local_38;
  pair<int,_int> local_30;
  vector<Gate,_std::allocator<Gate>_> *local_28;
  vector<Gate,_std::allocator<Gate>_> *gates_local;
  vector<Pheromone,_std::allocator<Pheromone>_> *pheromones_local;
  vector<Wall,_std::allocator<Wall>_> *walls_local;
  Ant *this_local;
  
  local_28 = gates;
  gates_local = (vector<Gate,_std::allocator<Gate>_> *)pheromones;
  pheromones_local = (vector<Pheromone,_std::allocator<Pheromone>_> *)walls;
  walls_local = (vector<Wall,_std::allocator<Wall>_> *)this;
  std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_30,&(this->t).x,&(this->t).y);
  std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_38,&this->x,&this->y);
  dVar2 = dist(&local_30,&local_38);
  if ((dVar2 == 0.0) && (!NAN(dVar2))) {
    updatePh(this,(vector<Wall,_std::allocator<Wall>_> *)pheromones_local,
             (vector<Pheromone,_std::allocator<Pheromone>_> *)gates_local,local_28);
  }
  if ((((this->t).x == this->x) && ((this->t).y != this->y)) &&
     ((this->direction != 1 || (this->direction != 3)))) {
    iVar1 = 3;
    if ((this->t).y < this->y) {
      iVar1 = 1;
    }
    setFacing(this,iVar1);
  }
  else if ((((this->t).y == this->y) && ((this->t).x != this->x)) &&
          ((this->direction != 0 || (this->direction != 2)))) {
    iVar1 = 2;
    if ((this->t).x < this->x) {
      iVar1 = 0;
    }
    setFacing(this,iVar1);
  }
  switch(this->direction) {
  case 0:
    this->x = this->x + -1;
    break;
  case 1:
    this->y = this->y + -1;
    break;
  case 2:
    this->x = this->x + 1;
    break;
  case 3:
    this->y = this->y + 1;
  }
  return this;
}

Assistant:

Ant& step(const vector<Wall> & walls, const vector<Pheromone> & pheromones, const vector<Gate> & gates) {
            if (dist({ t.x, t.y }, { x, y }) == 0)
                updatePh(walls, pheromones, gates);

            if (t.x == x && t.y != y && (direction != 1 || direction != 3))
                setFacing(t.y < y ? 1 : 3);
            else if (t.y == y && t.x != x && (direction != 0 || direction != 2))
                setFacing(t.x < x ? 0 : 2);

            switch(direction) {
                case 0:
                    x--;
                    break;
                case 1:
                    y--;
                    break;
                case 2:
                    x++;
                    break;
                case 3:
                    y++;
                    break;
                default:
                    break;
            }
            return *this;
        }